

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall summarycalc::doit(summarycalc *this)

{
  input_type iVar1;
  
  iVar1 = this->inputtype_;
  if (iVar1 == FM_STREAM) {
    dofmsummary(this);
    iVar1 = this->inputtype_;
  }
  else if (iVar1 == UNKNOWN) {
    fwrite("FATAL: summarycalc: stream type unknown\n",0x28,1,_stderr);
    return;
  }
  if (iVar1 == GUL_COVERAGE_STREAM) {
    dogulcoveragesummary(this);
    iVar1 = this->inputtype_;
  }
  if (iVar1 == GUL_ITEM_STREAM) {
    dogulitemsummary(this);
    iVar1 = this->inputtype_;
  }
  if (iVar1 == GUL_ITEMX_STREAM) {
    dogulitemxsummary(this);
    return;
  }
  return;
}

Assistant:

void summarycalc::doit()
{
	if (inputtype_ == UNKNOWN) {
		fprintf(stderr,"FATAL: summarycalc: stream type unknown\n");
		return;
	}
	
	if (inputtype_ == FM_STREAM) {
		dofmsummary();
	}
	
	if (inputtype_ == GUL_COVERAGE_STREAM) {
		dogulcoveragesummary();
	}
	if (inputtype_ == GUL_ITEM_STREAM) {
		dogulitemsummary();
	}
	if (inputtype_ == GUL_ITEMX_STREAM) {
		dogulitemxsummary();
	}
}